

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O2

void __thiscall WorldSolver::take_path(WorldSolver *this,WorldPath *path)

{
  pointer ppIVar1;
  Item *pIVar2;
  bool bVar3;
  Json *this_00;
  reference this_01;
  pointer ppIVar4;
  WorldNode *destination;
  WorldNode *local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  local_80 = path->_to_node;
  bVar3 = vectools::contains<WorldNode*>(&this->_explored_nodes,&local_80);
  if (!bVar3) {
    bVar3 = vectools::contains<WorldNode*>(&this->_nodes_to_explore,&local_80);
    if (!bVar3) {
      std::vector<WorldNode*,std::allocator<WorldNode*>>::emplace_back<WorldNode*&>
                ((vector<WorldNode*,std::allocator<WorldNode*>> *)&this->_nodes_to_explore,&local_80
                );
      this_00 = debug_log_for_current_step_abi_cxx11_(this);
      this_01 = nlohmann::
                basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)this_00,"exploration");
      std::operator+(&local_58,"Added ",&local_80->_id);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_58," to accessible nodes");
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  ppIVar1 = (path->_items_placed_when_crossing).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar4 = (path->_items_placed_when_crossing).
                 super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
                 ._M_start; ppIVar4 != ppIVar1; ppIVar4 = ppIVar4 + 1) {
    pIVar2 = *ppIVar4;
    empty_reachable_item_sources
              ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_58,this);
    local_78._8_8_ = local_58._M_dataplus._M_p;
    aStack_68._M_allocated_capacity = local_58._M_string_length;
    aStack_68._8_8_ = local_58.field_2._M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    local_78._0_8_ = pIVar2;
    std::
    vector<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>,std::allocator<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>>
    ::emplace_back<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>
              ((vector<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>,std::allocator<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>>
                *)&this->_scheduled_item_placements,
               (pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_> *)local_78);
    std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base
              ((_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_> *)(local_78 + 8));
    std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base
              ((_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_58);
  }
  return;
}

Assistant:

void WorldSolver::take_path(WorldPath* path)
{
    WorldNode* destination = path->destination();
    if (!vectools::contains(_explored_nodes, destination) && !vectools::contains(_nodes_to_explore, destination))
    {
        _nodes_to_explore.emplace_back(destination);

        Json& debug_log = this->debug_log_for_current_step();
        debug_log["exploration"].emplace_back("Added " + destination->id() + " to accessible nodes");
    }

    for(Item* item : path->items_placed_when_crossing())
    {
        _scheduled_item_placements.emplace_back(std::make_pair(
                item, this->empty_reachable_item_sources()
        ));
    }
}